

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
opengv::math::o3_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *p)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  double *pdVar6;
  iterator iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  complex<double> local_68;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double local_30;
  double local_28;
  
  pdVar6 = (p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar8 = *pdVar6;
  dVar11 = pdVar6[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar11;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8 * -3.0 * pdVar6[2];
  auVar5 = vfmadd231sd_fma(auVar20,auVar14,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = pdVar6[2] * dVar11 * dVar8 * -9.0;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar11 * (dVar11 + dVar11);
  auVar12 = vfmadd231sd_fma(auVar17,auVar14,auVar18);
  dVar11 = auVar5._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pdVar6[3];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar8 * dVar8 * 27.0;
  auVar5 = vfmadd132sd_fma(auVar19,auVar12,auVar5);
  local_48 = 0.0;
  dStack_40 = 0.0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar11 * dVar11 * dVar11 * -4.0;
  auVar12 = vfmadd231sd_fma(auVar12,auVar5,auVar5);
  dVar8 = auVar12._0_8_;
  if (0.0 <= dVar8) {
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
      dVar8 = auVar12._0_8_;
    }
    dVar8 = (auVar5._0_8_ + dVar8) * 0.5;
    if (0.0 <= dVar8) {
      local_48 = pow(dVar8,0.3333333333333333);
    }
    else {
      dVar8 = pow(-dVar8,0.3333333333333333);
      auVar13._0_8_ = -dVar8;
      auVar13._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_48 = (double)vmovlpd_avx(auVar13);
    }
    dStack_40 = 0.0;
  }
  else {
    dVar9 = auVar5._0_8_ * 0.5;
    auVar15._0_8_ = -dVar8;
    auVar15._8_8_ = auVar12._8_8_ ^ 0x8000000000000000;
    if (-0.0 < dVar8) {
      dVar8 = sqrt(auVar15._0_8_);
    }
    else {
      auVar5 = vsqrtsd_avx(auVar15,auVar15);
      dVar8 = auVar5._0_8_;
    }
    dVar8 = dVar8 * 0.5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar9 * dVar9 + dVar8 * dVar8;
    auVar5 = vsqrtsd_avx(auVar16,auVar16);
    dVar8 = atan(dVar8 / dVar9);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar9;
    uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar1,0xe);
    bVar4 = (bool)((byte)uVar3 & 1);
    local_58 = (double)((ulong)bVar4 * (long)(dVar8 + 3.141592653589793) +
                       (ulong)!bVar4 * (long)dVar8);
    dVar8 = pow(auVar5._0_8_,0.3333333333333333);
    local_58 = local_58 / 3.0;
    dVar9 = cos(local_58);
    dStack_40 = sin(local_58);
    dStack_40 = dStack_40 * dVar8;
    local_48 = dVar9 * dVar8;
  }
  dVar8 = *pdVar6;
  local_68._M_value._0_8_ = 1.0;
  local_68._M_value._8_8_ = 0;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  dVar2 = (double)local_68._M_value._0_8_ + pdVar6[1];
  local_68._M_value._0_8_ = 0x3ff0000000000000;
  local_68._M_value._8_8_ = 0;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  dVar10 = (double)__divdc3(dVar11,0,local_68._M_value._0_8_,local_68._M_value._8_8_);
  dVar9 = *pdVar6;
  local_68._M_value._0_8_ = -0.5;
  local_68._M_value._8_8_ = 0x3febb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  local_58 = (double)local_68._M_value._0_8_ + pdVar6[1];
  local_68._M_value._0_8_ = 0xbfe0000000000000;
  local_68._M_value._8_8_ = 0x3febb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  local_28 = (double)__divdc3(dVar11,0,local_68._M_value._0_8_,local_68._M_value._8_8_);
  local_30 = *pdVar6 * 3.0;
  local_68._M_value._0_8_ = -0.5;
  local_68._M_value._8_8_ = 0xbfebb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  local_38 = (double)local_68._M_value._0_8_ + pdVar6[1];
  local_68._M_value._0_8_ = 0xbfe0000000000000;
  local_68._M_value._8_8_ = 0xbfebb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  dVar11 = (double)__divdc3(dVar11,0,local_68._M_value._0_8_,local_68._M_value._8_8_);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_value._0_8_ = (dVar10 + dVar2) * (-1.0 / (dVar8 * 3.0));
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (__return_storage_ptr__,(iterator)0x0,(double *)&local_68);
  iVar7._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  pdVar6 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_68._M_value._0_8_ = (-1.0 / (dVar9 * 3.0)) * (local_28 + local_58);
  if (iVar7._M_current == pdVar6) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar7,(double *)&local_68);
    iVar7._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar6 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar7._M_current = (double)local_68._M_value._0_8_;
    iVar7._M_current = iVar7._M_current + 1;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current;
  }
  local_68._M_value._0_8_ = (-1.0 / local_30) * (dVar11 + local_38);
  if (iVar7._M_current == pdVar6) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar7,(double *)&local_68);
  }
  else {
    *iVar7._M_current = (double)local_68._M_value._0_8_;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
opengv::math::o3_roots( const std::vector<double> & p )
{
  const double & a = p[0];
  const double & b = p[1];
  const double & c = p[2];
  const double & d = p[3];
  
  double theta_0 = b*b - 3.0*a*c;
  double theta_1 = 2.0*b*b*b - 9.0*a*b*c + 27.0*a*a*d;
  double term = theta_1 * theta_1 - 4.0 * theta_0 * theta_0 * theta_0;
  
  std::complex<double> u1( 1.0, 0.0);
  std::complex<double> u2(-0.5, 0.5*sqrt(3.0));
  std::complex<double> u3(-0.5,-0.5*sqrt(3.0));
  std::complex<double> C;
  
  if( term >= 0.0 )
  {
    double C3 = 0.5 * (theta_1 + sqrt(term));
    
    if( C3 < 0.0 )
      C = std::complex<double>(-pow(-C3,(1.0/3.0)),0.0);
    else
      C = std::complex<double>( pow( C3,(1.0/3.0)),0.0);
  }
  else
  {
    std::complex<double> C3( 0.5*theta_1, 0.5*sqrt(-term) );
    
    //take the third root of this complex number
    double r3 = sqrt(pow(C3.real(),2.0)+pow(C3.imag(),2.0));
    double a3 = atan(C3.imag() / C3.real());
    if( C3.real() < 0 )
      a3 += M_PI;
    
    double r = pow(r3,(1.0/3.0));
    C = std::complex<double>(r*cos(a3/3.0),r*sin(a3/3.0));
  }
  
  std::complex<double> r1 = -(1.0/(3.0*a)) * (b + u1*C + theta_0 / (u1*C) );
  std::complex<double> r2 = -(1.0/(3.0*a)) * (b + u2*C + theta_0 / (u2*C) );
  std::complex<double> r3 = -(1.0/(3.0*a)) * (b + u3*C + theta_0 / (u3*C) );
  
  std::vector<double> roots;
  roots.push_back(r1.real());
  roots.push_back(r2.real());
  roots.push_back(r3.real());
  return roots;
}